

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void * big_alloc(size_t size)

{
  size_t len;
  size_t *psVar1;
  size_t *mem;
  size_t size_local;
  
  len = sys_round_size(size + 0x10);
  psVar1 = (size_t *)sys_alloc(len,'\x01');
  if (psVar1 == (size_t *)0x0) {
    size_local = 0;
  }
  else {
    *psVar1 = len;
    size_local = (size_t)(psVar1 + 2);
  }
  return (void *)size_local;
}

Assistant:

static inline void *big_alloc(size_t size) {
  size = sys_round_size(size + 16);
  size_t *mem = sys_alloc(size, 1);
  if (!mem)
    goto error;
  *mem = size;
  return (void *)(((uintptr_t)mem) + 16);
error:
  return NULL;
}